

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

JSAMPARRAY alloc_sarray(j_common_ptr cinfo,int pool_id,JDIMENSION samplesperrow,JDIMENSION numrows)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  JSAMPARRAY ppJVar3;
  JSAMPROW pJVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar6;
  ulong uVar10;
  
  pjVar1 = cinfo->mem;
  if (1000000000 < samplesperrow) {
    *(undefined8 *)&cinfo->err->msg_code = 0x900000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  uVar9 = samplesperrow + 0x3f & 0xffffffc0;
  uVar10 = (ulong)uVar9;
  uVar6 = 0x3b9ac9e8 / uVar10;
  if (0x3b9ac9e8 < uVar9) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x46;
    (*pjVar2->error_exit)(cinfo);
  }
  if (numrows <= (uint)uVar6) {
    uVar6 = (ulong)numrows;
  }
  *(int *)&pjVar1[1].access_virt_sarray = (int)uVar6;
  ppJVar3 = (JSAMPARRAY)alloc_small(cinfo,pool_id,(ulong)numrows << 3);
  if (numrows != 0) {
    uVar9 = 0;
    do {
      uVar8 = (ulong)(numrows - uVar9);
      if ((uint)uVar6 < numrows - uVar9) {
        uVar8 = uVar6;
      }
      pJVar4 = (JSAMPROW)alloc_large(cinfo,pool_id,uVar8 * uVar10);
      uVar5 = (uint)uVar8;
      uVar6 = uVar8;
      while (uVar5 != 0) {
        uVar7 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        ppJVar3[uVar7] = pJVar4;
        pJVar4 = pJVar4 + uVar10;
        uVar5 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar5;
      }
      uVar6 = uVar8;
    } while (uVar9 < numrows);
  }
  return ppJVar3;
}

Assistant:

METHODDEF(JSAMPARRAY)
alloc_sarray(j_common_ptr cinfo, int pool_id, JDIMENSION samplesperrow,
             JDIMENSION numrows)
/* Allocate a 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  JSAMPARRAY result;
  JSAMPROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Make sure each row is properly aligned */
  if ((ALIGN_SIZE % sizeof(JSAMPLE)) != 0)
    out_of_memory(cinfo, 5);    /* safety check */

  if (samplesperrow > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 9);
  }
  samplesperrow = (JDIMENSION)round_up_pow2(samplesperrow, (2 * ALIGN_SIZE) /
                                                           sizeof(JSAMPLE));

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK - sizeof(large_pool_hdr)) /
          ((long)samplesperrow * sizeof(JSAMPLE));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long)numrows)
    rowsperchunk = (JDIMENSION)ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JSAMPARRAY)alloc_small(cinfo, pool_id,
                                   (size_t)(numrows * sizeof(JSAMPROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JSAMPROW)alloc_large(cinfo, pool_id,
      (size_t)((size_t)rowsperchunk * (size_t)samplesperrow *
               sizeof(JSAMPLE)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += samplesperrow;
    }
  }

  return result;
}